

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflectance.cpp
# Opt level: O2

Spectrum * __thiscall
phyr::SpecularReflection::sample_f
          (Spectrum *__return_storage_ptr__,SpecularReflection *this,Vector3f *wo,Vector3f *wi,
          Point2f *sample,double *pdf,BxDFType *sampledType)

{
  double dVar1;
  uint uVar2;
  undefined4 uVar3;
  uint uVar4;
  CoefficientSpectrum<60> CStack_3e8;
  CoefficientSpectrum<60> local_208;
  
  uVar2 = *(uint *)((long)&wo->x + 4);
  uVar3 = *(undefined4 *)&wo->y;
  uVar4 = *(uint *)((long)&wo->y + 4);
  dVar1 = wo->z;
  *(undefined4 *)&wi->x = *(undefined4 *)&wo->x;
  *(uint *)((long)&wi->x + 4) = uVar2 ^ 0x80000000;
  *(undefined4 *)&wi->y = uVar3;
  *(uint *)((long)&wi->y + 4) = uVar4 ^ 0x80000000;
  wi->z = dVar1;
  *pdf = 1.0;
  (**this->fresnel->_vptr_Fresnel)(SUB84(wi->z,0),&CStack_3e8);
  CoefficientSpectrum<60>::operator*
            (&local_208,&CStack_3e8,&(this->R).super_CoefficientSpectrum<60>);
  CoefficientSpectrum<60>::operator/
            (&__return_storage_ptr__->super_CoefficientSpectrum<60>,&local_208,ABS(wi->z));
  return __return_storage_ptr__;
}

Assistant:

Spectrum SpecularReflection::sample_f(const Vector3f& wo, Vector3f* wi,
                                      const Point2f& sample, Real* pdf,
                                      BxDFType* sampledType) const {
    // Compute perfect specular reflection direction.
    // According to the shading coordinate space, n = (0, 0, 1),
    // so calculating the reflection vector for {wo} over {n}
    // is simplified to the following.
    *wi = Vector3f(-wo.x, -wo.y, wo.z);
    *pdf = 1;
    return fresnel->evaluate(cosTheta(*wi)) * R / absCosTheta(*wi);
}